

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O0

void __thiscall WorldShuffler::randomize_where_is_lithograph_hint(WorldShuffler *this)

{
  RandomizerWorld *this_00;
  bool bVar1;
  HintSource *pHVar2;
  ostream *poVar3;
  Item *item;
  string local_238;
  string local_218;
  stringstream local_1f8 [8];
  stringstream where_is_litho_hint;
  ostream local_1e8 [376];
  string local_70;
  allocator<char> local_39;
  string local_38;
  HintSource *local_18;
  HintSource *knc_sign_source;
  WorldShuffler *this_local;
  
  knc_sign_source = (HintSource *)this;
  bVar1 = RandomizerOptions::archipelago_world(this->_options);
  if (!bVar1) {
    this_00 = this->_world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"King Nole\'s Cave sign",&local_39);
    pHVar2 = RandomizerWorld::hint_source(this_00,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    local_18 = pHVar2;
    RandomizerWorld::add_used_hint_source(this->_world,pHVar2);
    HintSource::text_abi_cxx11_(&local_70,local_18);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::__cxx11::stringstream::stringstream(local_1f8);
      poVar3 = std::operator<<(local_1e8,"The lithograph will help you finding the jewels. It is ");
      item = World::item(&this->_world->super_World,'\'');
      random_hint_for_item_abi_cxx11_(&local_218,this,item);
      poVar3 = std::operator<<(poVar3,(string *)&local_218);
      std::operator<<(poVar3,".");
      std::__cxx11::string::~string((string *)&local_218);
      pHVar2 = local_18;
      std::__cxx11::stringstream::str();
      HintSource::text(pHVar2,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::stringstream::~stringstream(local_1f8);
    }
  }
  return;
}

Assistant:

void WorldShuffler::randomize_where_is_lithograph_hint()
{
    if(_options.archipelago_world())
        return;

    HintSource* knc_sign_source = _world.hint_source("King Nole's Cave sign");

    _world.add_used_hint_source(knc_sign_source);

    if(!knc_sign_source->text().empty())
        return;

    std::stringstream where_is_litho_hint;
    where_is_litho_hint << "The lithograph will help you finding the jewels. It is "
                        << this->random_hint_for_item(_world.item(ITEM_LITHOGRAPH))
                        << ".";

    knc_sign_source->text(where_is_litho_hint.str());
}